

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Statement * __thiscall soul::StructuralParser::parseLoopStatement(StructuralParser *this)

{
  bool bVar1;
  LoopStatement *pLVar2;
  Expression *pEVar3;
  Block *pBVar4;
  Context local_30;
  
  getContext(&local_30,this);
  pLVar2 = allocate<soul::AST::LoopStatement,soul::AST::Context>(this,&local_30);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_30);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29b537);
  if (bVar1) {
    pEVar3 = parseExpression(this,false);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299119);
    (pLVar2->numIterations).object = pEVar3;
  }
  pBVar4 = parseStatementAsNewBlock(this);
  (pLVar2->body).object = &pBVar4->super_Statement;
  return &pLVar2->super_Statement;
}

Assistant:

AST::Statement& parseLoopStatement()
    {
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());

        if (matchIf (Operator::openParen))
            loopStatement.numIterations = matchCloseParen (parseExpression());

        loopStatement.body = parseStatementAsNewBlock();
        return loopStatement;
    }